

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_ldrddi.cpp
# Opt level: O0

ze_result_t zesGetLedProcAddrTable(ze_api_version_t version,zes_led_dditable_t *pDdiTable)

{
  vector<loader::driver_t,_std::allocator<loader::driver_t>_> *this;
  bool bVar1;
  bool bVar2;
  ze_result_t zVar3;
  size_type sVar4;
  reference pdVar5;
  reference pvVar6;
  code *pcVar7;
  zes_pfnGetLedProcAddrTable_t getTable_1;
  ze_result_t getTableResult;
  zes_pfnGetLedProcAddrTable_t getTable;
  driver_t *drv;
  iterator __end1;
  iterator __begin1;
  driver_vector_t *__range1;
  bool atLeastOneDriverValid;
  ze_result_t result;
  zes_led_dditable_t *pDdiTable_local;
  ze_api_version_t version_local;
  
  sVar4 = std::vector<loader::driver_t,_std::allocator<loader::driver_t>_>::size
                    (*(vector<loader::driver_t,_std::allocator<loader::driver_t>_> **)
                      (loader::context + 0x1610));
  if (sVar4 == 0) {
    pDdiTable_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  else if (pDdiTable == (zes_led_dditable_t *)0x0) {
    pDdiTable_local._4_4_ = ZE_RESULT_ERROR_INVALID_NULL_POINTER;
  }
  else if (*(int *)(loader::context + 0x15c0) < (int)version) {
    pDdiTable_local._4_4_ = ZE_RESULT_ERROR_UNSUPPORTED_VERSION;
  }
  else {
    bVar1 = false;
    this = *(vector<loader::driver_t,_std::allocator<loader::driver_t>_> **)
            (loader::context + 0x1610);
    __end1 = std::vector<loader::driver_t,_std::allocator<loader::driver_t>_>::begin(this);
    drv = (driver_t *)std::vector<loader::driver_t,_std::allocator<loader::driver_t>_>::end(this);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<loader::driver_t_*,_std::vector<loader::driver_t,_std::allocator<loader::driver_t>_>_>
                                       *)&drv), bVar2) {
      pdVar5 = __gnu_cxx::
               __normal_iterator<loader::driver_t_*,_std::vector<loader::driver_t,_std::allocator<loader::driver_t>_>_>
               ::operator*(&__end1);
      if ((pdVar5->initStatus == ZE_RESULT_SUCCESS) &&
         (pcVar7 = (code *)dlsym(pdVar5->handle,"zesGetLedProcAddrTable"), pcVar7 != (code *)0x0)) {
        zVar3 = (*pcVar7)(version,&(pdVar5->dditable).zes.Led);
        if (zVar3 == ZE_RESULT_SUCCESS) {
          bVar1 = true;
        }
        else {
          pdVar5->initStatus = zVar3;
        }
      }
      __gnu_cxx::
      __normal_iterator<loader::driver_t_*,_std::vector<loader::driver_t,_std::allocator<loader::driver_t>_>_>
      ::operator++(&__end1);
    }
    if (bVar1) {
      __range1._4_4_ = ZE_RESULT_SUCCESS;
    }
    else {
      __range1._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
    }
    if (__range1._4_4_ == ZE_RESULT_SUCCESS) {
      sVar4 = std::vector<loader::driver_t,_std::allocator<loader::driver_t>_>::size
                        (*(vector<loader::driver_t,_std::allocator<loader::driver_t>_> **)
                          (loader::context + 0x1610));
      if ((sVar4 < 2) && ((*(byte *)(loader::context + 0x1629) & 1) == 0)) {
        pvVar6 = std::vector<loader::driver_t,_std::allocator<loader::driver_t>_>::front
                           (*(vector<loader::driver_t,_std::allocator<loader::driver_t>_> **)
                             (loader::context + 0x1610));
        pDdiTable->pfnGetProperties = (pvVar6->dditable).zes.Led.pfnGetProperties;
        pDdiTable->pfnGetState = (pvVar6->dditable).zes.Led.pfnGetState;
        pDdiTable->pfnSetState = (pvVar6->dditable).zes.Led.pfnSetState;
        pDdiTable->pfnSetColor = (pvVar6->dditable).zes.Led.pfnSetColor;
      }
      else {
        pDdiTable->pfnGetProperties = loader::zesLedGetProperties;
        pDdiTable->pfnGetState = loader::zesLedGetState;
        pDdiTable->pfnSetState = loader::zesLedSetState;
        pDdiTable->pfnSetColor = loader::zesLedSetColor;
      }
    }
    if ((__range1._4_4_ == ZE_RESULT_SUCCESS) && (*(long *)(loader::context + 0x1618) != 0)) {
      pcVar7 = (code *)dlsym(*(undefined8 *)(loader::context + 0x1618),"zesGetLedProcAddrTable");
      if (pcVar7 == (code *)0x0) {
        return ZE_RESULT_ERROR_UNINITIALIZED;
      }
      __range1._4_4_ = (*pcVar7)(version,pDdiTable);
    }
    pDdiTable_local._4_4_ = __range1._4_4_;
  }
  return pDdiTable_local._4_4_;
}

Assistant:

ZE_DLLEXPORT ze_result_t ZE_APICALL
zesGetLedProcAddrTable(
    ze_api_version_t version,                       ///< [in] API version requested
    zes_led_dditable_t* pDdiTable                   ///< [in,out] pointer to table of DDI function pointers
    )
{
    if( loader::context->sysmanInstanceDrivers->size() < 1 ) {
        return ZE_RESULT_ERROR_UNINITIALIZED;
    }

    if( nullptr == pDdiTable )
        return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

    if( loader::context->version < version )
        return ZE_RESULT_ERROR_UNSUPPORTED_VERSION;

    ze_result_t result = ZE_RESULT_SUCCESS;

    bool atLeastOneDriverValid = false;
    // Load the device-driver DDI tables
    for( auto& drv : *loader::context->sysmanInstanceDrivers )
    {
        if(drv.initStatus != ZE_RESULT_SUCCESS)
            continue;
        auto getTable = reinterpret_cast<zes_pfnGetLedProcAddrTable_t>(
            GET_FUNCTION_PTR( drv.handle, "zesGetLedProcAddrTable") );
        if(!getTable) 
            continue; 
        auto getTableResult = getTable( version, &drv.dditable.zes.Led);
        if(getTableResult == ZE_RESULT_SUCCESS) 
            atLeastOneDriverValid = true;
        else
            drv.initStatus = getTableResult;
    }

    if(!atLeastOneDriverValid)
        result = ZE_RESULT_ERROR_UNINITIALIZED;
    else
        result = ZE_RESULT_SUCCESS;

    if( ZE_RESULT_SUCCESS == result )
    {
        if( ( loader::context->sysmanInstanceDrivers->size() > 1 ) || loader::context->forceIntercept )
        {
            // return pointers to loader's DDIs
            pDdiTable->pfnGetProperties                            = loader::zesLedGetProperties;
            pDdiTable->pfnGetState                                 = loader::zesLedGetState;
            pDdiTable->pfnSetState                                 = loader::zesLedSetState;
            pDdiTable->pfnSetColor                                 = loader::zesLedSetColor;
        }
        else
        {
            // return pointers directly to driver's DDIs
            *pDdiTable = loader::context->sysmanInstanceDrivers->front().dditable.zes.Led;
        }
    }

    // If the validation layer is enabled, then intercept the loader's DDIs
    if(( ZE_RESULT_SUCCESS == result ) && ( nullptr != loader::context->validationLayer ))
    {
        auto getTable = reinterpret_cast<zes_pfnGetLedProcAddrTable_t>(
            GET_FUNCTION_PTR(loader::context->validationLayer, "zesGetLedProcAddrTable") );
        if(!getTable)
            return ZE_RESULT_ERROR_UNINITIALIZED;
        result = getTable( version, pDdiTable );
    }

    return result;
}